

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsyncSocket.h
# Opt level: O0

pair<int,_bool> __thiscall
uWS::AsyncSocket<false>::uncork(AsyncSocket<false> *this,char *src,int length,bool optionally)

{
  pair<int,_bool> pVar1;
  ssize_t sVar2;
  byte in_CL;
  uint in_EDX;
  int in_ESI;
  AsyncSocket<false> *in_RDI;
  type_conflict *failed;
  type *written;
  LoopData *loopData;
  bool local_4d;
  int local_4c;
  bool local_45;
  int local_44;
  type_conflict *local_40;
  type *local_38;
  undefined4 local_30;
  undefined1 local_2c;
  LoopData *local_28;
  byte local_1d;
  uint local_1c;
  int local_18;
  pair<int,_bool> local_8;
  
  local_1d = in_CL & 1;
  local_1c = in_EDX;
  local_18 = in_ESI;
  local_28 = getLoopData((AsyncSocket<false> *)0x2228c8);
  if ((AsyncSocket<false> *)local_28->corkedSocket == in_RDI) {
    local_28->corkedSocket = (void *)0x0;
    if (local_28->corkOffset != 0) {
      sVar2 = write(in_RDI,(int)local_28->corkBuffer,(void *)(ulong)(uint)local_28->corkOffset,0);
      local_30 = (undefined4)sVar2;
      local_2c = (undefined1)((ulong)sVar2 >> 0x20);
      local_38 = std::get<0ul,int,bool>((pair<int,_bool> *)0x22293f);
      local_40 = std::get<1ul,int,bool>((pair<int,_bool> *)0x22294e);
      local_28->corkOffset = 0;
      if ((*local_40 & 1U) != 0) {
        local_44 = 0;
        local_45 = true;
        std::pair<int,_bool>::pair<int,_bool,_true>(&local_8,&local_44,&local_45);
        goto LAB_002229df;
      }
    }
    sVar2 = write(in_RDI,local_18,(void *)(ulong)local_1c,(ulong)(local_1d & 1));
    local_8.first = (int)sVar2;
    local_8.second = SUB81((ulong)sVar2 >> 0x20,0);
  }
  else {
    local_4c = 0;
    local_4d = false;
    std::pair<int,_bool>::pair<int,_bool,_true>(&local_8,&local_4c,&local_4d);
  }
LAB_002229df:
  pVar1.second = local_8.second;
  pVar1._5_3_ = local_8._5_3_;
  pVar1.first = local_8.first;
  return pVar1;
}

Assistant:

std::pair<int, bool> uncork(const char *src = nullptr, int length = 0, bool optionally = false) {
        LoopData *loopData = getLoopData();

        if (loopData->corkedSocket == this) {
            loopData->corkedSocket = nullptr;

            if (loopData->corkOffset) {
                /* Corked data is already accounted for via its write call */
                auto [written, failed] = write(loopData->corkBuffer, loopData->corkOffset, false, length);
                loopData->corkOffset = 0;

                if (failed) {
                    /* We do not need to care for buffering here, write does that */
                    return {0, true};
                }
            }

            /* We should only return with new writes, not things written to cork already */
            return write(src, length, optionally, 0);
        } else {
            /* We are not even corked! */
            return {0, false};
        }
    }